

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCUtil.cpp
# Opt level: O2

void __thiscall Assimp::IFC::TempMesh::Transform(TempMesh *this,IfcMatrix4 *mat)

{
  pointer paVar1;
  IfcVector3 *v;
  pointer this_00;
  
  paVar1 = (this->mVerts).
           super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>._M_impl.
           super__Vector_impl_data._M_finish;
  for (this_00 = (this->mVerts).
                 super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>.
                 _M_impl.super__Vector_impl_data._M_start; this_00 != paVar1; this_00 = this_00 + 1)
  {
    aiVector3t<double>::operator*=(this_00,mat);
  }
  return;
}

Assistant:

void TempMesh::Transform(const IfcMatrix4& mat)
{
    for(IfcVector3& v : mVerts) {
        v *= mat;
    }
}